

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O2

int dwarf_get_arange(Dwarf_Arange *aranges,Dwarf_Unsigned arange_count,Dwarf_Addr address,
                    Dwarf_Arange *returned_arange,Dwarf_Error *error)

{
  Dwarf_Arange pDVar1;
  int iVar2;
  Dwarf_Unsigned DVar3;
  
  if (aranges == (Dwarf_Arange *)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x8a);
    iVar2 = 1;
  }
  else {
    iVar2 = -1;
    for (DVar3 = 0; arange_count != DVar3; DVar3 = DVar3 + 1) {
      pDVar1 = aranges[DVar3];
      if ((pDVar1->ar_address <= address) && (address < pDVar1->ar_address + pDVar1->ar_length)) {
        *returned_arange = pDVar1;
        return 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
dwarf_get_arange(Dwarf_Arange * aranges,
    Dwarf_Unsigned arange_count,
    Dwarf_Addr address,
    Dwarf_Arange * returned_arange, Dwarf_Error * error)
{
    Dwarf_Arange curr_arange = 0;
    Dwarf_Unsigned i = 0;

    if (!aranges) {
        _dwarf_error(NULL, error, DW_DLE_ARANGES_NULL);
        return DW_DLV_ERROR;
    }
    for (i = 0; i < arange_count; i++) {
        curr_arange = *(aranges + i);
        if (address >= curr_arange->ar_address &&
            address <
            curr_arange->ar_address + curr_arange->ar_length) {
            *returned_arange = curr_arange;
            return DW_DLV_OK;
        }
    }
    return DW_DLV_NO_ENTRY;
}